

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O2

string * __thiscall
pbrt::AtomicFloat::ToString_abi_cxx11_(string *__return_storage_ptr__,AtomicFloat *this)

{
  __atomic_base<unsigned_int> local_c;
  
  local_c._M_i = (this->bits).super___atomic_base<unsigned_int>._M_i;
  StringPrintf<float>(__return_storage_ptr__,"%f",(float *)&local_c);
  return __return_storage_ptr__;
}

Assistant:

std::string AtomicFloat::ToString() const {
    return StringPrintf("%f", float(*this));
}